

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::ElementsTable::GetRGB
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,ElementsTable *this,
          int atomicnum)

{
  double *pdVar1;
  pointer ppEVar2;
  iterator iVar3;
  double local_28;
  
  if (this->init_ == false) {
    Init(this);
  }
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve(__return_storage_ptr__,3);
  if ((atomicnum < 0) ||
     (ppEVar2 = (this->elements_).
                super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
                super__Vector_impl_data._M_start,
     (int)((ulong)((long)(this->elements_).
                         super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2) >> 3) <=
     atomicnum)) {
    local_28 = 0.0;
    iVar3._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (iVar3._M_current == pdVar1) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (__return_storage_ptr__,iVar3,&local_28);
      iVar3._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar3._M_current = 0.0;
      iVar3._M_current = iVar3._M_current + 1;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current;
    }
    local_28 = 0.0;
    if (iVar3._M_current == pdVar1) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (__return_storage_ptr__,iVar3,&local_28);
      iVar3._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar3._M_current = 0.0;
      iVar3._M_current = iVar3._M_current + 1;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current;
    }
    local_28 = 0.0;
    if (iVar3._M_current == pdVar1) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (__return_storage_ptr__,iVar3,&local_28);
      return __return_storage_ptr__;
    }
    *iVar3._M_current = 0.0;
  }
  else {
    local_28 = ppEVar2[(uint)atomicnum]->red_;
    iVar3._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (iVar3._M_current == pdVar1) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (__return_storage_ptr__,iVar3,&local_28);
      ppEVar2 = (this->elements_).
                super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar3._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar3._M_current = local_28;
      iVar3._M_current = iVar3._M_current + 1;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current;
    }
    local_28 = ppEVar2[(uint)atomicnum]->green_;
    if (iVar3._M_current == pdVar1) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (__return_storage_ptr__,iVar3,&local_28);
      ppEVar2 = (this->elements_).
                super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar3._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar3._M_current = local_28;
      iVar3._M_current = iVar3._M_current + 1;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current;
    }
    local_28 = ppEVar2[(uint)atomicnum]->blue_;
    if (iVar3._M_current == pdVar1) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (__return_storage_ptr__,iVar3,&local_28);
      return __return_storage_ptr__;
    }
    *iVar3._M_current = local_28;
  }
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  return __return_storage_ptr__;
}

Assistant:

std::vector<RealType> ElementsTable::GetRGB(int atomicnum) {
    if (!init_) Init();

    std::vector<RealType> colors;
    colors.reserve(3);

    if (atomicnum < 0 || atomicnum >= static_cast<int>(elements_.size())) {
      colors.push_back(0.0);
      colors.push_back(0.0);
      colors.push_back(0.0);
      return (colors);
    }

    colors.push_back(elements_[atomicnum]->GetRed());
    colors.push_back(elements_[atomicnum]->GetGreen());
    colors.push_back(elements_[atomicnum]->GetBlue());

    return (colors);
  }